

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt6FirstBit(word t)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  if (t == 0) {
    return -1;
  }
  bVar6 = (int)t == 0;
  uVar3 = t >> 0x20;
  if (!bVar6) {
    uVar3 = t;
  }
  iVar4 = (uint)bVar6 * 0x20;
  iVar5 = iVar4 + 0x10;
  uVar1 = uVar3 >> 0x10;
  if ((short)uVar3 != 0) {
    iVar5 = iVar4;
    uVar1 = uVar3;
  }
  iVar4 = iVar5 + 8;
  uVar3 = uVar1 >> 8;
  if ((char)uVar1 != '\0') {
    iVar4 = iVar5;
    uVar3 = uVar1;
  }
  iVar5 = iVar4 + 4;
  uVar1 = uVar3 >> 4;
  if ((uVar3 & 0xf) != 0) {
    iVar5 = iVar4;
    uVar1 = uVar3;
  }
  uVar2 = (uint)(uVar1 >> 2) & 0x3fffffff;
  iVar4 = iVar5 + 2;
  if ((uVar1 & 3) != 0) {
    uVar2 = (uint)uVar1;
    iVar4 = iVar5;
  }
  return (~uVar2 & 1) + iVar4;
}

Assistant:

static inline int Abc_Tt6FirstBit( word t )
{
    int n = 0;
    if ( t == 0 ) return -1;
    if ( (t & ABC_CONST(0x00000000FFFFFFFF)) == 0 ) { n += 32; t >>= 32; }
    if ( (t & ABC_CONST(0x000000000000FFFF)) == 0 ) { n += 16; t >>= 16; }
    if ( (t & ABC_CONST(0x00000000000000FF)) == 0 ) { n +=  8; t >>=  8; }
    if ( (t & ABC_CONST(0x000000000000000F)) == 0 ) { n +=  4; t >>=  4; }
    if ( (t & ABC_CONST(0x0000000000000003)) == 0 ) { n +=  2; t >>=  2; }
    if ( (t & ABC_CONST(0x0000000000000001)) == 0 ) { n++; }
    return n;
}